

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

float units::detail::power_const<float>(float val,int power)

{
  int in_EDI;
  float in_XMM0_Da;
  float fVar1;
  float local_20;
  float local_1c;
  float local_14;
  int in_stack_fffffffffffffff0;
  float in_stack_fffffffffffffff4;
  
  if (in_EDI < 2) {
    if (in_EDI < -1) {
      fVar1 = power_const<float>(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0);
      fVar1 = sqr_power<float>(fVar1);
      local_1c = in_XMM0_Da;
      if (-in_EDI % 2 == 0) {
        local_1c = 1.0;
      }
      local_20 = 1.0 / (fVar1 * local_1c);
    }
    else {
      local_20 = power_const_small<float>(in_XMM0_Da,in_EDI);
    }
    local_14 = local_20;
  }
  else {
    fVar1 = power_const<float>(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0);
    local_14 = sqr_power<float>(fVar1);
    if (in_EDI % 2 == 0) {
      in_XMM0_Da = 1.0;
    }
    local_14 = local_14 * in_XMM0_Da;
  }
  return local_14;
}

Assistant:

constexpr X power_const(X val, int power)
    {
        return (power > 1) ? sqr_power(power_const(val, power / 2)) *
                (power % 2 == 0 ? X{1.0} : val) :
            (power < -1) ? X{1.0} /
                (sqr_power(power_const(val, (-power) / 2)) *
                 ((-power) % 2 == 0 ? X{1.0} : val)) :
                           power_const_small(val, power);
    }